

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_batch.c
# Opt level: O2

int log_policy_storage_batch_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *__ptr;
  void *pvVar1;
  int iVar2;
  size_t __size;
  
  __ptr = (undefined8 *)malloc(0x18);
  iVar2 = 1;
  if (__ptr != (undefined8 *)0x0) {
    __ptr[1] = 0;
    if ((ctor == (log_policy_ctor)0x0) || (__size = *ctor, 0xfe00 < __size - 0x200)) {
      __size = 0x200;
    }
    __ptr[2] = __size;
    pvVar1 = malloc(__size);
    *__ptr = pvVar1;
    if (pvVar1 == (void *)0x0) {
      free(__ptr);
    }
    else {
      iVar2 = 0;
      log_policy_instantiate(policy,__ptr,0);
    }
  }
  return iVar2;
}

Assistant:

static int log_policy_storage_batch_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_storage_batch_data batch_data = malloc(sizeof(struct log_policy_storage_batch_data_type));

	const log_policy_storage_batch_ctor batch_ctor = ctor;

	if (batch_data == NULL)
	{
		return 1;
	}

	batch_data->count = 0;

	if (batch_ctor != NULL && batch_ctor->size >= LOG_POLICY_STORAGE_BATCH_MIN_SIZE && batch_ctor->size <= LOG_POLICY_STORAGE_BATCH_MAX_SIZE)
	{
		batch_data->size = batch_ctor->size;
	}
	else
	{
		batch_data->size = LOG_POLICY_STORAGE_BATCH_MIN_SIZE;
	}

	batch_data->buffer = malloc(batch_data->size);

	if (batch_data->buffer == NULL)
	{
		free(batch_data);

		return 1;
	}

	log_policy_instantiate(policy, batch_data, LOG_POLICY_STORAGE_BATCH);

	return 0;
}